

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.cpp
# Opt level: O2

Graph create_graph(void)

{
  Graph graph;
  long lVar1;
  istream *piVar2;
  ostream *poVar3;
  uint uVar4;
  int iVar5;
  char c;
  int end;
  int start;
  int length;
  
  graph = (Graph)malloc(0x7a1230);
  for (lVar1 = 1; lVar1 != 0xf4246; lVar1 = lVar1 + 1) {
    graph->head[lVar1 + -1] = (adjacentNode)0x0;
  }
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)graph);
  std::istream::operator>>(piVar2,&graph->edge_num);
  iVar5 = 0;
  for (uVar4 = 0; (int)uVar4 < graph->edge_num; uVar4 = uVar4 + 1) {
    piVar2 = std::operator>>((istream *)&std::cin,&c);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&start);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&end);
    std::istream::operator>>(piVar2,&length);
    add_edge(graph,start,end,length);
    if ((uVar4 / 200) * 200 + iVar5 == 0) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar4);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    iVar5 = iVar5 + -1;
  }
  return graph;
}

Assistant:

Graph create_graph() {
    int length, start, end;
//    alloc the space gor graph
    Graph graph = (Graph) malloc(sizeof(struct _graph));
//    init the matrix
    for (int i = 0; i < MAX; ++i) {
        graph->head[i] = nullptr;
    }
//    read the numbers
    char c;
    cin >> graph->vertex_num >> graph->edge_num;
//    read each lines
    for (int i = 0; i < graph->edge_num; i++) {
        cin >> c >> start >> end >> length;
        add_edge(graph, start, end, length);
        if (i % 200 == 0) {
            cout << i << endl;
        }
    }
    return graph;
}